

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O2

void at(tagval *args,int numargs)

{
  tagval *ptVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  long lVar6;
  char *start;
  char *end;
  tagval *local_50;
  long local_48;
  long local_40;
  char *list;
  
  if (numargs != 0) {
    local_50 = args;
    pcVar4 = tagval::getstr(args);
    start = pcVar4;
    sVar5 = strlen(pcVar4);
    end = pcVar4 + sVar5;
    local_48 = (long)numargs;
    lVar6 = 1;
    while (ptVar1 = commandret, lVar6 < local_48) {
      list = start;
      local_40 = lVar6;
      iVar3 = tagval::getint(local_50 + lVar6);
      iVar3 = iVar3 + 1;
      do {
        iVar3 = iVar3 + -1;
        if (iVar3 < 1) {
          bVar2 = parselist(&list,&start,&end,&listquotestart,&listquoteend);
          if (bVar2) goto LAB_0012e1dc;
          break;
        }
        bVar2 = parselist(&list,&liststart,&listend,&listquotestart,&listquoteend);
      } while (bVar2);
      end = "";
      start = "";
LAB_0012e1dc:
      lVar6 = local_40 + 1;
    }
    pcVar4 = newstring(start,(long)end - (long)start);
    ptVar1->type = 3;
    (ptVar1->super_identval).field_0.s = pcVar4;
  }
  return;
}

Assistant:

void at(tagval *args, int numargs)
{
    if(!numargs) return;
    const char *start = args[0].getstr(), *end = start + strlen(start);
    for(int i = 1; i < numargs; i++)
    {
        const char *list = start;
        int pos = args[i].getint();
        for(; pos > 0; pos--) if(!parselist(list)) break;
        if(pos > 0 || !parselist(list, start, end)) start = end = "";
    }
    commandret->setstr(newstring(start, end-start));
}